

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

Data<QHashPrivate::Node<QString,_VcsolutionDepend_*>_> *
QHashPrivate::Data<QHashPrivate::Node<QString,_VcsolutionDepend_*>_>::detached
          (Data<QHashPrivate::Node<QString,_VcsolutionDepend_*>_> *d,size_t size)

{
  bool bVar1;
  Data<QHashPrivate::Node<QString,_VcsolutionDepend_*>_> *in_RSI;
  Data<QHashPrivate::Node<QString,_VcsolutionDepend_*>_> *in_RDI;
  Data<QHashPrivate::Node<QString,_VcsolutionDepend_*>_> *dd;
  size_t in_stack_00000038;
  RefCount *in_stack_ffffffffffffffd8;
  Data<QHashPrivate::Node<QString,_VcsolutionDepend_*>_> *in_stack_ffffffffffffffe0;
  Data<QHashPrivate::Node<QString,_VcsolutionDepend_*>_> *local_8;
  
  if (in_RDI == (Data<QHashPrivate::Node<QString,_VcsolutionDepend_*>_> *)0x0) {
    local_8 = (Data<QHashPrivate::Node<QString,_VcsolutionDepend_*>_> *)operator_new(0x28);
    Data(in_stack_ffffffffffffffe0,(size_t)local_8);
  }
  else {
    local_8 = (Data<QHashPrivate::Node<QString,_VcsolutionDepend_*>_> *)operator_new(0x28);
    Data(in_RDI,in_RSI,in_stack_00000038);
    bVar1 = QtPrivate::RefCount::deref(in_stack_ffffffffffffffd8);
    if ((!bVar1) && (in_RDI != (Data<QHashPrivate::Node<QString,_VcsolutionDepend_*>_> *)0x0)) {
      ~Data(in_RDI);
      operator_delete(in_RDI,0x28);
    }
  }
  return local_8;
}

Assistant:

static Data *detached(Data *d, size_t size)
    {
        if (!d)
            return new Data(size);
        Data *dd = new Data(*d, size);
        if (!d->ref.deref())
            delete d;
        return dd;
    }